

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_decimal_result<char16_t_*>
fmt::v8::detail::format_decimal<char16_t,unsigned_long>(char16_t *out,unsigned_long value,int size)

{
  char16_t *pcVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  format_decimal_result<char16_t_*> fVar7;
  
  lVar3 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  if (size < (int)((uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] -
                  (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                           (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10
                                                        [lVar3] * 8)))) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
               ,0x45e,"invalid digit count");
  }
  pcVar1 = out + size;
  uVar4 = value;
  pcVar5 = pcVar1;
  pcVar6 = pcVar1;
  if (99 < value) {
    do {
      pcVar5 = pcVar6 + -2;
      value = uVar4 / 100;
      pcVar6[-2] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [(uVar4 % 100) * 2];
      pcVar6[-1] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [(uVar4 % 100) * 2 + 1];
      bVar2 = 9999 < uVar4;
      uVar4 = value;
      pcVar6 = pcVar5;
    } while (bVar2);
  }
  if (value < 10) {
    pcVar5[-1] = (ushort)value | 0x30;
    pcVar5 = pcVar5 + -1;
  }
  else {
    pcVar5[-2] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [value * 2];
    pcVar5[-1] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [value * 2 + 1];
    pcVar5 = pcVar5 + -2;
  }
  fVar7.end = pcVar1;
  fVar7.begin = pcVar5;
  return fVar7;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}